

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<unsigned_int,_1UL>::resize(SmallVector<unsigned_int,_1UL> *this,size_t newSize)

{
  unsigned_long *puVar1;
  unsigned_long local_20;
  ulong local_18;
  size_t newSize_local;
  SmallVector<unsigned_int,_1UL> *this_local;
  
  local_20 = 1;
  local_18 = newSize;
  newSize_local = (size_t)this;
  puVar1 = std::min<unsigned_long>(&local_20,&local_18);
  this->usedFixed = *puVar1;
  if (local_18 < 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->flexible);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->flexible,local_18 - 1);
  }
  return;
}

Assistant:

void resize(size_t newSize) {
    usedFixed = std::min(N, newSize);
    if (newSize > N) {
      flexible.resize(newSize - N);
    } else {
      flexible.clear();
    }
  }